

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O2

string * __thiscall
glcts::CullDistance::NegativeTest::getTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest *this,int n_test_iteration,
          bool should_redeclare_output_variables,bool use_dynamic_index_based_writes)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream stream;
  stringstream asStack_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(&local_198,"Test iteration [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,n_test_iteration);
  poVar1 = std::operator<<(poVar1,"] which uses a vertex shader that:\n\n");
  pcVar2 = "* does not redeclare gl_ClipDistance and gl_CullDistance arrays\n";
  if (should_redeclare_output_variables) {
    pcVar2 = "* redeclares gl_ClipDistance and gl_CullDistance arrays\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "* uses static writes\n";
  if (use_dynamic_index_based_writes) {
    pcVar2 = "* uses dynamic index-based writes\n";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string CullDistance::NegativeTest::getTestDescription(int n_test_iteration, bool should_redeclare_output_variables,
														   bool use_dynamic_index_based_writes)
{
	std::stringstream stream;

	stream << "Test iteration [" << n_test_iteration << "] which uses a vertex shader that:\n\n"
		   << ((should_redeclare_output_variables) ?
				   "* redeclares gl_ClipDistance and gl_CullDistance arrays\n" :
				   "* does not redeclare gl_ClipDistance and gl_CullDistance arrays\n")
		   << ((use_dynamic_index_based_writes) ? "* uses dynamic index-based writes\n" : "* uses static writes\n");

	return stream.str();
}